

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnns_index.h
# Opt level: O0

void __thiscall
gnns::Gnns_Index<L2Distance<float>_>::setDataset
          (Gnns_Index<L2Distance<float>_> *this,Matrix<float> *data)

{
  float *local_28;
  uint local_1c;
  Matrix<float> *pMStack_18;
  int i;
  Matrix<float> *data_local;
  Gnns_Index<L2Distance<float>_> *this_local;
  
  this->points_num = data->rows;
  this->vec_len = data->cols;
  pMStack_18 = data;
  data_local = (Matrix<float> *)this;
  for (local_1c = 0; local_1c < this->points_num; local_1c = local_1c + 1) {
    local_28 = Matrix<float>::operator[](pMStack_18,local_1c);
    std::vector<float_*,_std::allocator<float_*>_>::push_back(&this->points,&local_28);
  }
  return;
}

Assistant:

void setDataset(const Matrix<ElementType>& data)
        {
            this->points_num = data.rows;
            this->vec_len = data.cols;
            for(int i=0;i<points_num;++i)
            {
                points.push_back(data[i]);
            }
        }